

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O1

int slang::ast::BinsSelectExpr::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  SyntaxKind SVar1;
  ParenthesizedBinsSelectExprSyntax *pPVar2;
  UnaryBinsSelectExprSyntax *this;
  BinsSelectExpr *pBVar3;
  BinaryBinsSelectExprSyntax *this_00;
  SimpleBinsSelectExprSyntax *syntax;
  BinsSelectConditionExprSyntax *syntax_00;
  BinSelectWithFilterExprSyntax *this_01;
  logic_error *this_02;
  long *plVar4;
  size_type *psVar5;
  long *plVar6;
  ASTContext *context;
  ASTContext *context_00;
  ASTContext *context_01;
  SyntaxNode *this_03;
  undefined4 in_register_0000003c;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_03 = (SyntaxNode *)CONCAT44(in_register_0000003c,__fd);
  while (SVar1 = this_03->kind, SVar1 == ParenthesizedBinsSelectExpr) {
    pPVar2 = slang::syntax::SyntaxNode::as<slang::syntax::ParenthesizedBinsSelectExprSyntax>
                       (this_03);
    this_03 = &((pPVar2->expr).ptr)->super_SyntaxNode;
    if (this_03 == (SyntaxNode *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<slang::syntax::BinsSelectExpressionSyntax *>::get() const [T = slang::syntax::BinsSelectExpressionSyntax *]"
                );
    }
  }
  if ((int)SVar1 < 0x31) {
    if (SVar1 == BinSelectWithFilterExpr) {
      this_01 = slang::syntax::SyntaxNode::as<slang::syntax::BinSelectWithFilterExprSyntax>(this_03)
      ;
      pBVar3 = BinSelectWithFilterExpr::fromSyntax
                         ((BinSelectWithFilterExpr *)this_01,(BinSelectWithFilterExprSyntax *)__addr
                          ,context_01);
    }
    else {
      if (SVar1 != BinaryBinsSelectExpr) {
LAB_003c27f2:
        this_02 = (logic_error *)__cxa_allocate_exception(0x10);
        local_90[0] = local_80;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_90,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/CoverSymbols.cpp"
                   ,"");
        plVar4 = (long *)std::__cxx11::string::append((char *)local_90);
        local_d0._M_dataplus._M_p = (pointer)*plVar4;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_d0._M_dataplus._M_p == psVar5) {
          local_d0.field_2._M_allocated_capacity = *psVar5;
          local_d0.field_2._8_8_ = plVar4[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar5;
        }
        local_d0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::to_string(&local_70,0x3ab);
        std::operator+(&local_50,&local_d0,&local_70);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_b0 = (long *)*plVar4;
        plVar6 = plVar4 + 2;
        if (local_b0 == plVar6) {
          local_a0 = *plVar6;
          lStack_98 = plVar4[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar6;
        }
        local_a8 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_f0 = (long *)*plVar4;
        plVar6 = plVar4 + 2;
        if (local_f0 == plVar6) {
          local_e0 = *plVar6;
          lStack_d8 = plVar4[3];
          local_f0 = &local_e0;
        }
        else {
          local_e0 = *plVar6;
        }
        local_e8 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::logic_error::logic_error(this_02,(string *)&local_f0);
        __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      this_00 = slang::syntax::SyntaxNode::as<slang::syntax::BinaryBinsSelectExprSyntax>(this_03);
      pBVar3 = BinaryBinsSelectExpr::fromSyntax
                         ((BinaryBinsSelectExpr *)this_00,(BinaryBinsSelectExprSyntax *)__addr,
                          context_00);
    }
  }
  else if (SVar1 == BinsSelectConditionExpr) {
    syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::BinsSelectConditionExprSyntax>(this_03)
    ;
    pBVar3 = ConditionBinsSelectExpr::fromSyntax(syntax_00,(ASTContext *)__addr);
  }
  else if (SVar1 == SimpleBinsSelectExpr) {
    syntax = slang::syntax::SyntaxNode::as<slang::syntax::SimpleBinsSelectExprSyntax>(this_03);
    pBVar3 = SetExprBinsSelectExpr::fromSyntax(syntax,(ASTContext *)__addr);
  }
  else {
    if (SVar1 != UnaryBinsSelectExpr) goto LAB_003c27f2;
    this = slang::syntax::SyntaxNode::as<slang::syntax::UnaryBinsSelectExprSyntax>(this_03);
    pBVar3 = UnaryBinsSelectExpr::fromSyntax
                       ((UnaryBinsSelectExpr *)this,(UnaryBinsSelectExprSyntax *)__addr,context);
  }
  pBVar3->syntax = this_03;
  return (int)pBVar3;
}

Assistant:

const BinsSelectExpr& BinsSelectExpr::bind(const BinsSelectExpressionSyntax& syntax,
                                           const ASTContext& context) {
    BinsSelectExpr* result;
    switch (syntax.kind) {
        case SyntaxKind::ParenthesizedBinsSelectExpr:
            return bind(*syntax.as<ParenthesizedBinsSelectExprSyntax>().expr, context);
        case SyntaxKind::BinsSelectConditionExpr:
            result = &ConditionBinsSelectExpr::fromSyntax(
                syntax.as<BinsSelectConditionExprSyntax>(), context);
            break;
        case SyntaxKind::UnaryBinsSelectExpr:
            result = &UnaryBinsSelectExpr::fromSyntax(syntax.as<UnaryBinsSelectExprSyntax>(),
                                                      context);
            break;
        case SyntaxKind::BinaryBinsSelectExpr:
            result = &BinaryBinsSelectExpr::fromSyntax(syntax.as<BinaryBinsSelectExprSyntax>(),
                                                       context);
            break;
        case SyntaxKind::SimpleBinsSelectExpr:
            result = &SetExprBinsSelectExpr::fromSyntax(syntax.as<SimpleBinsSelectExprSyntax>(),
                                                        context);
            break;
        case SyntaxKind::BinSelectWithFilterExpr:
            result = &BinSelectWithFilterExpr::fromSyntax(
                syntax.as<BinSelectWithFilterExprSyntax>(), context);
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    result->syntax = &syntax;
    return *result;
}